

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgp_to_gl(djg_program *program,int version,bool compatible,bool link,GLuint *gl)

{
  byte bVar1;
  GLint GVar2;
  GLboolean GVar3;
  bool bVar4;
  GLuint program_00;
  djg_program *it;
  djg_program *pdVar5;
  GLchar **source;
  GLchar **ppGVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  GLchar *__ptr;
  size_t sVar10;
  size_t sVar11;
  byte bVar12;
  int i;
  int count;
  size_t sStack_1050;
  GLint logc;
  char head [4096];
  
  if ((program == (djg_program *)0x0) || (gl == (GLuint *)0x0)) {
    __assert_fail("program && gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x1f9,"bool djgp_to_gl(const djg_program *, int, bool, bool, GLuint *)");
  }
  count = 0;
  pdVar5 = program;
  sVar11 = 0;
  do {
    sVar10 = sVar11;
    pdVar5 = pdVar5->next;
    count = count + 1;
    sVar11 = sVar10 + 8;
  } while (pdVar5 != (djg_program *)0x0);
  source = (GLchar **)malloc(sVar11);
  ppGVar6 = source;
  while( true ) {
    ppGVar6 = ppGVar6 + 1;
    program = program->next;
    if (program == (djg_program *)0x0) break;
    *ppGVar6 = program->src;
  }
  pcVar9 = *(char **)((long)source + sVar10);
  pcVar7 = strstr(pcVar9,"VERTEX_SHADER");
  pcVar8 = strstr(pcVar9,"FRAGMENT_SHADER");
  bVar12 = (pcVar7 != (char *)0x0) + 2;
  if (pcVar8 == (char *)0x0) {
    bVar12 = pcVar7 != (char *)0x0;
  }
  pcVar7 = strstr(pcVar9,"GEOMETRY_SHADER");
  bVar1 = bVar12 + 4;
  if (pcVar7 == (char *)0x0) {
    bVar1 = bVar12;
  }
  pcVar7 = strstr(pcVar9,"TESS_CONTROL_SHADER");
  bVar12 = bVar1 + 8;
  if (pcVar7 == (char *)0x0) {
    bVar12 = bVar1;
  }
  pcVar7 = strstr(pcVar9,"TESS_EVALUATION_SHADER");
  bVar1 = bVar12 | 0x10;
  if (pcVar7 == (char *)0x0) {
    bVar1 = bVar12;
  }
  pcVar7 = strstr(pcVar9,"COMPUTE_SHADER");
  bVar12 = bVar1 | 0x80;
  if (pcVar7 == (char *)0x0) {
    bVar12 = bVar1;
  }
  pcVar7 = strstr(pcVar9,"TASK_SHADER");
  bVar1 = bVar12 | 0x20;
  if (pcVar7 == (char *)0x0) {
    bVar1 = bVar12;
  }
  pcVar9 = strstr(pcVar9,"MESH_SHADER");
  bVar12 = bVar1 | 0x40;
  if (pcVar9 == (char *)0x0) {
    bVar12 = bVar1;
  }
  if (bVar12 == 0) {
    pcVar9 = "djg_error: no shader stage found in source\n";
    sStack_1050 = 0x2b;
  }
  else {
    program_00 = (*glad_glCreateProgram)();
    GVar3 = (*glad_glIsProgram)(program_00);
    if (GVar3 != '\0') {
      if ((bVar12 & 1) == 0) {
LAB_00157c16:
        if ((bVar12 & 2) != 0) {
          head._0_4_ = head._0_4_ & 0xffffff00;
          pcVar9 = "";
          if (compatible) {
            pcVar9 = "compatibility";
          }
          sprintf(head,"#version %d %s\n",(ulong)(uint)version,pcVar9);
          sVar11 = strlen(head);
          builtin_strncpy(head + sVar11,"#define FRAGMENT_SHADER 1\n",0x1b);
          *source = head;
          bVar4 = djgp__attach_shader(program_00,0x8b30,count,source);
          if (!bVar4) goto LAB_00157eeb;
        }
        if ((bVar12 & 4) != 0) {
          head._0_4_ = head._0_4_ & 0xffffff00;
          pcVar9 = "";
          if (compatible) {
            pcVar9 = "compatibility";
          }
          sprintf(head,"#version %d %s\n",(ulong)(uint)version,pcVar9);
          sVar11 = strlen(head);
          builtin_strncpy(head + sVar11,"#define GEOMETRY_SHADER 1\n",0x1b);
          *source = head;
          bVar4 = djgp__attach_shader(program_00,0x8dd9,count,source);
          if (!bVar4) goto LAB_00157eeb;
        }
        if ((bVar12 & 8) != 0) {
          head._0_4_ = head._0_4_ & 0xffffff00;
          pcVar9 = "";
          if (compatible) {
            pcVar9 = "compatibility";
          }
          sprintf(head,"#version %d %s\n",(ulong)(uint)version,pcVar9);
          sVar11 = strlen(head);
          builtin_strncpy(head + sVar11,"#define TESS_CONTROL_SHADER 1\n",0x1f);
          *source = head;
          bVar4 = djgp__attach_shader(program_00,0x8e88,count,source);
          if (!bVar4) goto LAB_00157eeb;
        }
        if ((bVar12 & 0x10) != 0) {
          head._0_4_ = head._0_4_ & 0xffffff00;
          pcVar9 = "";
          if (compatible) {
            pcVar9 = "compatibility";
          }
          sprintf(head,"#version %d %s\n",(ulong)(uint)version,pcVar9);
          sVar11 = strlen(head);
          builtin_strncpy(head + sVar11,"#define TESS_EVALUATION_SHADER 1\n",0x22);
          *source = head;
          bVar4 = djgp__attach_shader(program_00,0x8e87,count,source);
          if (!bVar4) goto LAB_00157eeb;
        }
        if (-1 < (char)bVar12) {
LAB_00157e70:
          if (link) {
            head[0] = '\0';
            head[1] = '\0';
            head[2] = '\0';
            head[3] = '\0';
            (*glad_glLinkProgram)(program_00);
            (*glad_glGetProgramiv)(program_00,0x8b82,(GLint *)head);
            if (head._0_4_ == 0) {
              logc = 0;
              (*glad_glGetProgramiv)(program_00,0x8b84,&logc);
              GVar2 = logc;
              __ptr = (GLchar *)malloc((long)logc);
              (*glad_glGetProgramInfoLog)(program_00,GVar2,(GLsizei *)0x0,__ptr);
              fprintf(_stdout,
                      "djg_error: GLSL linker failure\n                     -- Begin -- GLSL Linker Info Log\n                     %s\n                     -- End -- GLSL Linker Info Log\n"
                      ,__ptr);
              fflush(_stdout);
              (*glad_glDeleteProgram)(program_00);
              free(__ptr);
              free(source);
              return false;
            }
          }
          free(source);
          GVar3 = (*glad_glIsProgram)(*gl);
          if (GVar3 != '\0') {
            (*glad_glDeleteProgram)(*gl);
          }
          *gl = program_00;
          return true;
        }
        head._0_4_ = head._0_4_ & 0xffffff00;
        pcVar9 = "";
        if (compatible) {
          pcVar9 = "compatibility";
        }
        sprintf(head,"#version %d %s\n",(ulong)(uint)version,pcVar9);
        sVar11 = strlen(head);
        builtin_strncpy(head + sVar11,"#define COMPUTE_SHADER 1\n",0x1a);
        *source = head;
        bVar4 = djgp__attach_shader(program_00,0x91b9,count,source);
        if (bVar4) goto LAB_00157e70;
      }
      else {
        head._0_4_ = head._0_4_ & 0xffffff00;
        pcVar9 = "";
        if (compatible) {
          pcVar9 = "compatibility";
        }
        sprintf(head,"#version %d %s\n",(ulong)(uint)version,pcVar9);
        sVar11 = strlen(head);
        builtin_strncpy(head + sVar11,"#define VERTEX_SHADER 1\n",0x19);
        *source = head;
        bVar4 = djgp__attach_shader(program_00,0x8b31,count,source);
        if (bVar4) goto LAB_00157c16;
      }
LAB_00157eeb:
      (*glad_glDeleteProgram)(program_00);
      goto LAB_00157f1c;
    }
    pcVar9 = "djg_error: glCreateProgram failed\n";
    sStack_1050 = 0x22;
  }
  fwrite(pcVar9,sStack_1050,1,_stdout);
  fflush(_stdout);
LAB_00157f1c:
  free(source);
  return false;
}

Assistant:

DJGDEF bool
djgp_to_gl(
    const djg_program *program,
    int version,
    bool compatible,
    bool link,
    GLuint *gl
) {
    const GLchar **srcv;
    djg_program *it;
    int i, srcc, stages = 0;
    GLuint glprogram;

    DJG_ASSERT(program && gl);

    // prepare sources
    srcc = djgp__count(program) + /* head */1;
    srcv = (const GLchar **)DJG_MALLOC(sizeof(GLchar *) * srcc);

    // set source pointers
    it = program->next;
    i = 1;
    while (it) {
        srcv[i] = it->src;
        it = it->next;
        ++i;
    }

    // look for stages in the last source file
    if (strstr(srcv[srcc-1], "VERTEX_SHADER"))
        stages|= DJGP__STAGE_VERTEX_BIT;
    if (strstr(srcv[srcc-1], "FRAGMENT_SHADER"))
        stages|= DJGP__STAGE_FRAGMENT_BIT;
    if (strstr(srcv[srcc-1], "GEOMETRY_SHADER"))
        stages|= DJGP__STAGE_GEOMETRY_BIT;
    if (strstr(srcv[srcc-1], "TESS_CONTROL_SHADER"))
        stages|= DJGP__STAGE_TESS_CONTROL_BIT;
    if (strstr(srcv[srcc-1], "TESS_EVALUATION_SHADER"))
        stages|= DJGP__STAGE_TESS_EVALUATION_BIT;
    if (strstr(srcv[srcc-1], "COMPUTE_SHADER"))
        stages|= DJGP__STAGE_COMPUTE_BIT;
    if (strstr(srcv[srcc-1], "TASK_SHADER"))
        stages|= DJGP__STAGE_TASK_BIT;
    if (strstr(srcv[srcc-1], "MESH_SHADER"))
        stages|= DJGP__STAGE_MESH_BIT;

    if (!stages) {
        DJG_LOG("djg_error: no shader stage found in source\n");
        DJG_FREE(srcv);
        return false;
    }
    // load program
    glprogram = glCreateProgram();
    if (!glIsProgram(glprogram)) {
        DJG_LOG("djg_error: glCreateProgram failed\n");
        DJG_FREE(srcv);
        return false;
    }

#define DJGP__ATTACH_SHADER(glstage, str, bit)                        \
    if (stages & bit) {                                               \
        char head[DJG__CHAR_BUFFER_SIZE];                             \
        head[0] = '\0';                                               \
                                                                      \
        sprintf(head,                                                 \
                "#version %d %s\n",                                   \
                version,                                              \
                compatible ? "compatibility" : "");                   \
        strcat(head, "#define " str " 1\n");                          \
        srcv[0] = head;                                               \
        if (!djgp__attach_shader(glprogram, glstage, srcc, srcv)) {   \
            glDeleteProgram(glprogram);                               \
            DJG_FREE(srcv);                                           \
            return false;                                             \
        }                                                             \
    }
    DJGP__ATTACH_SHADER(GL_VERTEX_SHADER, "VERTEX_SHADER", DJGP__STAGE_VERTEX_BIT);
    DJGP__ATTACH_SHADER(GL_FRAGMENT_SHADER, "FRAGMENT_SHADER", DJGP__STAGE_FRAGMENT_BIT);
#if defined(GL_GEOMETRY_SHADER)
    DJGP__ATTACH_SHADER(GL_GEOMETRY_SHADER, "GEOMETRY_SHADER", DJGP__STAGE_GEOMETRY_BIT);
#endif
#if defined(GL_TESS_CONTROL_SHADER)
    DJGP__ATTACH_SHADER(GL_TESS_CONTROL_SHADER, "TESS_CONTROL_SHADER", DJGP__STAGE_TESS_CONTROL_BIT);
#endif
#if defined(GL_TESS_EVALUATION_SHADER)
    DJGP__ATTACH_SHADER(GL_TESS_EVALUATION_SHADER, "TESS_EVALUATION_SHADER", DJGP__STAGE_TESS_EVALUATION_BIT);
#endif
#if defined(GL_COMPUTE_SHADER)
    DJGP__ATTACH_SHADER(GL_COMPUTE_SHADER, "COMPUTE_SHADER", DJGP__STAGE_COMPUTE_BIT);
#endif
#if defined(GL_TASK_SHADER_NV)
    DJGP__ATTACH_SHADER(GL_TASK_SHADER_NV, "TASK_SHADER", DJGP__STAGE_TASK_BIT);
#endif
#if defined(GL_MESH_SHADER_NV)
    DJGP__ATTACH_SHADER(GL_MESH_SHADER_NV, "MESH_SHADER", DJGP__STAGE_MESH_BIT);
#endif

#undef DJGP__ATTACH_SHADER

    // link if requested
    if (link) {
        GLint link_status = 0;

        glLinkProgram(glprogram);
        glGetProgramiv(glprogram, GL_LINK_STATUS, &link_status);
        if (!link_status) {
            GLint logc = 0;
            GLchar *logv = NULL;

            glGetProgramiv(glprogram, GL_INFO_LOG_LENGTH, &logc);
            logv = (GLchar *)DJG_MALLOC(logc);
            glGetProgramInfoLog(glprogram, logc, NULL, logv);
            DJG_LOG("djg_error: GLSL linker failure\n\
                     -- Begin -- GLSL Linker Info Log\n\
                     %s\n\
                     -- End -- GLSL Linker Info Log\n", logv);
            glDeleteProgram(glprogram);
            DJG_FREE(logv);
            DJG_FREE(srcv);
            return false;
        }
    }

    // cleanup
    DJG_FREE(srcv);
    // affect program
    if (glIsProgram (*gl)) glDeleteProgram(*gl);
    *gl = glprogram;

    return true;
}